

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_binder.cpp
# Opt level: O1

optional_idx __thiscall
duckdb::OrderBinder::TryGetProjectionReference(OrderBinder *this,ParsedExpression *expr)

{
  ExpressionClass EVar1;
  SelectBindState *this_00;
  pointer pcVar2;
  bool bVar3;
  ConstantExpression *pCVar4;
  int64_t iVar5;
  PositionalReferenceExpression *pPVar6;
  ColumnRefExpression *this_01;
  reference __k;
  iterator iVar7;
  const_reference pvVar8;
  ClientConfig *pCVar9;
  BinderException *this_02;
  idx_t iVar10;
  optional_idx local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  EVar1 = (expr->super_BaseExpression).expression_class;
  if (EVar1 == COLUMN_REF) {
    this_01 = BaseExpression::Cast<duckdb::ColumnRefExpression>(&expr->super_BaseExpression);
    bVar3 = ColumnRefExpression::IsQualified(this_01);
    if (!bVar3) {
      this_00 = this->bind_state;
      __k = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ::operator[](&this_01->column_names,0);
      iVar7 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this_00,__k);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
          ._M_cur != (__node_type *)0x0) {
        iVar10 = *(idx_t *)((long)iVar7.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                  ._M_cur + 0x28);
        goto LAB_01217579;
      }
    }
  }
  else {
    if (EVar1 == POSITIONAL_REFERENCE) {
      pPVar6 = BaseExpression::Cast<duckdb::PositionalReferenceExpression>
                         (&expr->super_BaseExpression);
      iVar10 = pPVar6->index - 1;
LAB_01217579:
      optional_idx::optional_idx(&local_78,iVar10);
      return (optional_idx)local_78.index;
    }
    if (EVar1 == CONSTANT) {
      pCVar4 = BaseExpression::Cast<duckdb::ConstantExpression>(&expr->super_BaseExpression);
      bVar3 = LogicalType::IsIntegral(&(pCVar4->value).type_);
      if (bVar3) {
        iVar5 = Value::GetValue<long>(&pCVar4->value);
        iVar10 = 0x7fffffffffffffff;
        if (0 < iVar5) {
          iVar10 = iVar5 - 1;
        }
        optional_idx::optional_idx(&local_78,iVar10);
      }
      else {
        pvVar8 = vector<std::reference_wrapper<duckdb::Binder>,_true>::operator[](&this->binders,0);
        pCVar9 = ClientConfig::GetConfig(pvVar8->_M_data->context);
        if (pCVar9->order_by_non_integer_literal == false) {
          this_02 = (BinderException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,
                     "%s non-integer literal has no effect.\n* SET order_by_non_integer_literal=true to allow this behavior."
                     ,"");
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          pcVar2 = (this->query_component)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar2,pcVar2 + (this->query_component)._M_string_length);
          BinderException::BinderException<std::__cxx11::string>(this_02,expr,&local_50,&local_70);
          __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      if (bVar3) {
        return (optional_idx)local_78.index;
      }
    }
  }
  return (optional_idx)0xffffffffffffffff;
}

Assistant:

optional_idx OrderBinder::TryGetProjectionReference(ParsedExpression &expr) const {
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::CONSTANT: {
		auto &constant = expr.Cast<ConstantExpression>();
		// ORDER BY a constant
		if (!constant.value.type().IsIntegral()) {
			// non-integral expression
			// ORDER BY <constant> has no effect
			// this is disabled by default (matching Postgres) - but we can control this with a setting
			auto &config = ClientConfig::GetConfig(binders[0].get().context);
			if (!config.order_by_non_integer_literal) {
				throw BinderException(expr,
				                      "%s non-integer literal has no effect.\n* SET "
				                      "order_by_non_integer_literal=true to allow this behavior.",
				                      query_component);
			}
			break;
		}
		// INTEGER constant: we use the integer as an index into the select list (e.g. ORDER BY 1)
		auto order_value = constant.value.GetValue<int64_t>();
		return static_cast<idx_t>(order_value <= 0 ? NumericLimits<int64_t>::Maximum() : order_value - 1);
	}
	case ExpressionClass::COLUMN_REF: {
		auto &colref = expr.Cast<ColumnRefExpression>();
		// if there is an explicit table name we can't bind to an alias
		if (colref.IsQualified()) {
			break;
		}
		// check the alias list
		auto entry = bind_state.alias_map.find(colref.column_names[0]);
		if (entry == bind_state.alias_map.end()) {
			break;
		}
		// this is an alias - return the index
		return entry->second;
	}
	case ExpressionClass::POSITIONAL_REFERENCE: {
		auto &posref = expr.Cast<PositionalReferenceExpression>();
		return posref.index - 1;
	}
	default:
		break;
	}
	return optional_idx();
}